

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData * cfd::core::CryptoUtil::DecodeBase58(ByteData *__return_storage_ptr__,string *str)

{
  char *str_in;
  uchar *bytes_out;
  size_type len;
  CfdException *this;
  allocator local_91;
  string local_90;
  CfdSourceLocation local_70;
  int local_54;
  size_type sStack_50;
  int ret;
  size_t written;
  allocator<unsigned_char> local_31;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  string *str_local;
  
  output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)str;
  ::std::allocator<unsigned_char>::allocator(&local_31);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0x400,&local_31);
  ::std::allocator<unsigned_char>::~allocator(&local_31);
  sStack_50 = 0;
  str_in = (char *)::std::__cxx11::string::data();
  bytes_out = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  local_54 = wally_base58_to_bytes(str_in,0,bytes_out,len,&stack0xffffffffffffffb0);
  if (local_54 != 0) {
    local_70.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_util.cpp"
                 ,0x2f);
    local_70.filename = local_70.filename + 1;
    local_70.line = 0x3e2;
    local_70.funcname = "DecodeBase58";
    logger::warn<int&>(&local_70,"wally_base58_to_bytes NG[{}].",&local_54);
    this = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_90,"Decode base58 error.",&local_91);
    CfdException::CfdException(this,kCfdIllegalStateError,&local_90);
    __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,sStack_50);
  ByteData::ByteData(__return_storage_ptr__,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

ByteData CryptoUtil::DecodeBase58(const std::string &str) {
  std::vector<uint8_t> output(1024);
  size_t written = 0;

  int ret = wally_base58_to_bytes(
      str.data(), 0, output.data(), output.size(), &written);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_base58_to_bytes NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "Decode base58 error.");
  }

  output.resize(written);
  return ByteData(output);
}